

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValue.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::KeyValue::updateConfig
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,KeyValue *this,Parameters *parameters)

{
  Client *client;
  allocator<char> local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  string local_68;
  Url local_48;
  Parameters *local_20;
  Parameters *parameters_local;
  KeyValue *this_local;
  
  local_20 = parameters;
  parameters_local = (Parameters *)this;
  this_local = (KeyValue *)__return_storage_ptr__;
  if (this->version_ == v2) {
    client = this->client_;
    Vault::operator+(&local_68,"/v1/",&this->mount_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"/config",&local_a9);
    Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Tiny(&local_88,&local_a8);
    (*client->_vptr_Client[3])(&local_48,client,&local_68,&local_88);
    HttpConsumer::post(__return_storage_ptr__,client,&local_48,local_20);
    Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Tiny(&local_48);
    Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Tiny(&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
    std::__cxx11::string::~string((string *)&local_68);
  }
  else {
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Vault::KeyValue::updateConfig(const Parameters &parameters) {
  if (version_ != KeyValue::Version::v2) {
    return std::nullopt;
  }

  return Vault::HttpConsumer::post(
      client_, client_.getUrl("/v1/" + mount_, Vault::Path{"/config"}),
      parameters);
}